

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_3::DBIter::FindPrevUserEntry(DBIter *this)

{
  string *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 extraout_var_00;
  size_type __len2;
  ulong extraout_RDX;
  ValueType VVar7;
  long in_FS_OFFSET;
  ParsedInternalKey ikey;
  string empty;
  ParsedInternalKey local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->direction_ != kReverse) {
    __assert_fail("direction_ == kReverse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0xed,"void leveldb::(anonymous namespace)::DBIter::FindPrevUserEntry()");
  }
  iVar4 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar4 != '\0') {
    __s = &this->saved_value_;
    paVar1 = &(this->saved_value_).field_2;
    VVar7 = kTypeDeletion;
    do {
      local_78.user_key.data_ = "";
      local_78.user_key.size_ = 0;
      bVar3 = ParseKey(this,&local_78);
      if ((bVar3) && (local_78.sequence <= this->sequence_)) {
        if (VVar7 != kTypeDeletion) {
          local_58._M_dataplus._M_p = (this->saved_key_)._M_dataplus._M_p;
          local_58._M_string_length = (this->saved_key_)._M_string_length;
          iVar4 = (*this->user_comparator_->_vptr_Comparator[2])
                            (this->user_comparator_,&local_78,&local_58);
          if (iVar4 < 0) goto LAB_0064149d;
        }
        VVar7 = local_78.type;
        if (local_78.type == kTypeDeletion) {
          (this->saved_key_)._M_string_length = 0;
          *(this->saved_key_)._M_dataplus._M_p = '\0';
          pcVar2 = (this->saved_value_)._M_dataplus._M_p;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar2 == paVar1) ||
             ((this->saved_value_).field_2._M_allocated_capacity < 0x100001)) {
            (this->saved_value_)._M_string_length = 0;
            *pcVar2 = '\0';
          }
          else {
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                      (&local_58,__s);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
          VVar7 = kTypeDeletion;
        }
        else {
          iVar4 = (*this->iter_->_vptr_Iterator[9])();
          uVar6 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this->saved_value_)._M_dataplus._M_p != paVar1) {
            uVar6 = (this->saved_value_).field_2._M_allocated_capacity;
          }
          if (__len2 + 0x100000 < uVar6) {
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                      (&local_58,__s);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
          iVar5 = (*this->iter_->_vptr_Iterator[8])();
          if (extraout_RDX < 8) {
            __assert_fail("internal_key.size() >= 8",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                          ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&this->saved_key_,0,(this->saved_key_)._M_string_length,
                     (char *)CONCAT44(extraout_var_00,iVar5),extraout_RDX - 8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(__s,0,(this->saved_value_)._M_string_length,
                     (char *)CONCAT44(extraout_var,iVar4),__len2);
        }
      }
      (*this->iter_->_vptr_Iterator[7])();
      iVar4 = (*this->iter_->_vptr_Iterator[2])();
    } while ((char)iVar4 != '\0');
    if (VVar7 != kTypeDeletion) {
LAB_0064149d:
      this->valid_ = true;
      goto LAB_0064152e;
    }
  }
  this->valid_ = false;
  (this->saved_key_)._M_string_length = 0;
  *(this->saved_key_)._M_dataplus._M_p = '\0';
  pcVar2 = (this->saved_value_)._M_dataplus._M_p;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 == &(this->saved_value_).field_2) ||
     ((this->saved_value_).field_2._M_allocated_capacity < 0x100001)) {
    (this->saved_value_)._M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
              (&local_58,&this->saved_value_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  this->direction_ = kForward;
LAB_0064152e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBIter::FindPrevUserEntry() {
  assert(direction_ == kReverse);

  ValueType value_type = kTypeDeletion;
  if (iter_->Valid()) {
    do {
      ParsedInternalKey ikey;
      if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
        if ((value_type != kTypeDeletion) &&
            user_comparator_->Compare(ikey.user_key, saved_key_) < 0) {
          // We encountered a non-deleted value in entries for previous keys,
          break;
        }
        value_type = ikey.type;
        if (value_type == kTypeDeletion) {
          saved_key_.clear();
          ClearSavedValue();
        } else {
          Slice raw_value = iter_->value();
          if (saved_value_.capacity() > raw_value.size() + 1048576) {
            std::string empty;
            swap(empty, saved_value_);
          }
          SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
          saved_value_.assign(raw_value.data(), raw_value.size());
        }
      }
      iter_->Prev();
    } while (iter_->Valid());
  }

  if (value_type == kTypeDeletion) {
    // End
    valid_ = false;
    saved_key_.clear();
    ClearSavedValue();
    direction_ = kForward;
  } else {
    valid_ = true;
  }
}